

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  BigNumber *pBVar9;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double in_XMM1_Qa;
  BigNumber a;
  BigNumber dv1;
  BigNumber ml1;
  BigNumber c;
  BigNumber d;
  BigNumber sb1;
  BigNumber ad1;
  string local_1b10;
  string local_1af0;
  string local_1ad0;
  string local_1ab0;
  string local_1a90;
  string local_1a70;
  string local_1a50;
  string local_1a30;
  BigNumber local_1a10;
  BigNumber local_19f0;
  BigNumber local_19d0;
  string local_19b0;
  BigNumber local_1990;
  BigNumber local_1970;
  BigNumber local_1950;
  string local_1930;
  BigNumber local_1910;
  BigNumber local_18f0;
  BigNumber local_18d0;
  string local_18b0;
  BigNumber local_1890;
  BigNumber local_1870;
  BigNumber local_1850;
  string local_1830;
  string local_1810;
  string local_17f0;
  string local_17d0;
  string local_17b0;
  string local_1790;
  string local_1770;
  string local_1750;
  string local_1730;
  string local_1710;
  string local_16f0;
  string local_16d0;
  string local_16b0;
  string local_1690;
  string local_1670;
  string local_1650;
  string local_1630;
  string local_1610;
  string local_15f0;
  string local_15d0;
  string local_15b0;
  string local_1590;
  string local_1570;
  string local_1550;
  string local_1530;
  string local_1510;
  string local_14f0;
  string local_14d0;
  string local_14b0;
  string local_1490;
  string local_1470;
  string local_1450;
  string local_1430;
  string local_1410;
  string local_13f0;
  string local_13d0;
  string local_13b0;
  string local_1390;
  string local_1370;
  string local_1350;
  string local_1330;
  string local_1310;
  string local_12f0;
  string local_12d0;
  string local_12b0;
  string local_1290;
  string local_1270;
  string local_1250;
  string local_1230;
  string local_1210;
  string local_11f0;
  string local_11d0;
  string local_11b0;
  string local_1190;
  string local_1170;
  string local_1150;
  string local_1130;
  string local_1110;
  string local_10f0;
  string local_10d0;
  string local_10b0;
  string local_1090;
  string local_1070;
  string local_1050;
  string local_1030;
  string local_1010;
  string local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  BigNumber local_f50;
  BigNumber local_f30;
  BigNumber local_f10;
  BigNumber local_ef0;
  BigNumber local_ed0;
  BigNumber local_eb0;
  BigNumber local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  BigNumber local_db0;
  BigNumber local_d90;
  BigNumber local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  BigNumber local_bd0;
  BigNumber local_bb0;
  BigNumber local_b90;
  BigNumber local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  BigNumber local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  BigNumber local_7b0;
  BigNumber local_790;
  BigNumber local_770;
  BigNumber local_750;
  BigNumber local_730;
  BigNumber local_710;
  BigNumber local_6f0;
  BigNumber local_6d0;
  BigNumber local_6b0;
  BigNumber local_690;
  BigNumber local_670;
  BigNumber local_650;
  BigNumber local_630;
  BigNumber local_610;
  BigNumber local_5f0;
  BigNumber local_5d0;
  BigNumber local_5b0;
  BigNumber local_590;
  BigNumber local_570;
  BigNumber local_550;
  BigNumber local_530;
  BigNumber local_510;
  BigNumber local_4f0;
  BigNumber local_4d0;
  BigNumber local_4b0;
  BigNumber local_490;
  BigNumber local_470;
  BigNumber local_450;
  BigNumber local_430;
  BigNumber local_410;
  BigNumber local_3f0;
  BigNumber local_3d0;
  BigNumber local_3b0;
  BigNumber local_390;
  BigNumber local_370;
  BigNumber local_350;
  BigNumber local_330;
  BigNumber local_310;
  BigNumber local_2f0;
  BigNumber local_2d0;
  BigNumber local_2b0;
  BigNumber local_290;
  BigNumber local_270;
  BigNumber local_250;
  BigNumber local_230;
  BigNumber local_210;
  BigNumber local_1f0;
  string local_1d0;
  BigNumber local_1b0;
  BigNumber local_190;
  BigNumber local_170;
  BigNumber local_150;
  BigNumber local_130;
  BigNumber local_110;
  BigNumber local_f0;
  BigNumber local_d0;
  BigNumber local_b0;
  BigNumber local_90;
  BigNumber local_70;
  BigNumber local_50;
  
  BigNumber::BigNumber(&local_b0,0x32);
  BigNumber::BigNumber((BigNumber *)&local_1ad0,0x20);
  operator+((BigNumber *)&local_1a70,&local_b0,(BigNumber *)&local_1ad0);
  BigNumber::getString_abi_cxx11_(&local_1a30,(BigNumber *)&local_1a70);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a30);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(50) + BigNumber(32)).getString() == \"82\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0xd,"int main()");
  }
  paVar2 = &local_1a30.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a30._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a30._M_dataplus._M_p,local_1a30.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_1a70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_1ad0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._numberString._M_dataplus._M_p != &local_b0._numberString.field_2) {
    operator_delete(local_b0._numberString._M_dataplus._M_p,
                    local_b0._numberString.field_2._M_allocated_capacity + 1);
  }
  BigNumber::BigNumber(&local_d0,5);
  BigNumber::BigNumber((BigNumber *)&local_1ad0,0x26e);
  operator+((BigNumber *)&local_1a70,&local_d0,(BigNumber *)&local_1ad0);
  BigNumber::getString_abi_cxx11_(&local_1a30,(BigNumber *)&local_1a70);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a30);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(5) + BigNumber(622)).getString() == \"627\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0xe,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a30._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a30._M_dataplus._M_p,local_1a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._numberString._M_dataplus._M_p != &local_d0._numberString.field_2) {
    operator_delete(local_d0._numberString._M_dataplus._M_p,
                    local_d0._numberString.field_2._M_allocated_capacity + 1);
  }
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"-33","");
  BigNumber::BigNumber(&local_f0,&local_7d0);
  local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"8","");
  BigNumber::BigNumber((BigNumber *)&local_1ad0,&local_7f0);
  operator+((BigNumber *)&local_1a70,&local_f0,(BigNumber *)&local_1ad0);
  BigNumber::getString_abi_cxx11_(&local_1a30,(BigNumber *)&local_1a70);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a30);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"-33\") + BigNumber(\"8\")).getString() == \"-25\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0xf,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a30._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a30._M_dataplus._M_p,local_1a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
    operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._numberString._M_dataplus._M_p != &local_f0._numberString.field_2) {
    operator_delete(local_f0._numberString._M_dataplus._M_p,
                    local_f0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
  }
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"15535","");
  BigNumber::BigNumber(&local_110,&local_810);
  local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_830,"0","");
  BigNumber::BigNumber((BigNumber *)&local_1ad0,&local_830);
  operator+((BigNumber *)&local_1a70,&local_110,(BigNumber *)&local_1ad0);
  BigNumber::getString_abi_cxx11_(&local_1a30,(BigNumber *)&local_1a70);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a30);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"15535\") + BigNumber(\"0\")).getString() == \"15535\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x10,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a30._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a30._M_dataplus._M_p,local_1a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_830._M_dataplus._M_p != &local_830.field_2) {
    operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._numberString._M_dataplus._M_p != &local_110._numberString.field_2) {
    operator_delete(local_110._numberString._M_dataplus._M_p,
                    local_110._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
  }
  local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"126","");
  BigNumber::BigNumber(&local_130,&local_850);
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"39285","");
  BigNumber::BigNumber((BigNumber *)&local_1ad0,&local_870);
  operator+((BigNumber *)&local_1a70,&local_130,(BigNumber *)&local_1ad0);
  BigNumber::getString_abi_cxx11_(&local_1a30,(BigNumber *)&local_1a70);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a30);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"126\") + BigNumber(\"39285\")).getString() == \"39411\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x11,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a30._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a30._M_dataplus._M_p,local_1a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._numberString._M_dataplus._M_p != &local_130._numberString.field_2) {
    operator_delete(local_130._numberString._M_dataplus._M_p,
                    local_130._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
  }
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"0","");
  BigNumber::BigNumber(&local_150,&local_890);
  local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b0,"0","");
  BigNumber::BigNumber((BigNumber *)&local_1ad0,&local_8b0);
  operator+((BigNumber *)&local_1a70,&local_150,(BigNumber *)&local_1ad0);
  BigNumber::getString_abi_cxx11_(&local_1a30,(BigNumber *)&local_1a70);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a30);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"0\") + BigNumber(\"0\")).getString() == \"0\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x12,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a30._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a30._M_dataplus._M_p,local_1a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._numberString._M_dataplus._M_p != &local_150._numberString.field_2) {
    operator_delete(local_150._numberString._M_dataplus._M_p,
                    local_150._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
  }
  BigNumber::BigNumber(&local_90,5);
  local_1a30._M_dataplus._M_p = (pointer)0xa;
  operator+(&local_170,&local_90,(longlong *)&local_1a30);
  local_1a70._M_dataplus._M_p = (pointer)0xf;
  bVar6 = operator==(&local_170,(longlong *)&local_1a70);
  if (!bVar6) {
    __assert_fail("BigNumber(5) + 10 == 15",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x13,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._numberString._M_dataplus._M_p != &local_170._numberString.field_2) {
    operator_delete(local_170._numberString._M_dataplus._M_p,
                    local_170._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._numberString._M_dataplus._M_p != &local_90._numberString.field_2) {
    operator_delete(local_90._numberString._M_dataplus._M_p,
                    local_90._numberString.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"-41","");
  BigNumber::BigNumber(&local_1b0,&local_1d0);
  local_1a30._M_dataplus._M_p = (pointer)0x28;
  operator+(&local_190,&local_1b0,(longlong *)&local_1a30);
  local_1a70._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  bVar6 = operator==(&local_190,(longlong *)&local_1a70);
  if (!bVar6) {
    __assert_fail("BigNumber(\"-41\") + 40 == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x14,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._numberString._M_dataplus._M_p != &local_190._numberString.field_2) {
    operator_delete(local_190._numberString._M_dataplus._M_p,
                    local_190._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._numberString._M_dataplus._M_p != &local_1b0._numberString.field_2) {
    operator_delete(local_1b0._numberString._M_dataplus._M_p,
                    local_1b0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  BigNumber::BigNumber((BigNumber *)&local_1a30,600);
  local_1a70._M_dataplus._M_p = (pointer)0x32;
  BigNumber::operator+=((BigNumber *)&local_1a30,(longlong *)&local_1a70);
  local_1a70._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a70,"50","");
  BigNumber::operator+=((BigNumber *)&local_1a30,&local_1a70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1a30);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("ad1.getString() == \"700\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x18,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_8d0._numberString.field_2;
  local_8d0._numberString._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8d0,local_1a30._M_dataplus._M_p,
             local_1a30._M_dataplus._M_p + local_1a30._M_string_length);
  local_1a70._M_dataplus._M_p = (pointer)0x2bc;
  bVar6 = operator==(&local_8d0,(longlong *)&local_1a70);
  if (!bVar6) {
    __assert_fail("ad1 == 700",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x19,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._numberString._M_dataplus._M_p != paVar2) {
    operator_delete(local_8d0._numberString._M_dataplus._M_p,
                    local_8d0._numberString.field_2._M_allocated_capacity + 1);
  }
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"50","");
  BigNumber::BigNumber(&local_1f0,&local_8f0);
  local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_910,"32","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_910);
  operator-((BigNumber *)&local_1ad0,&local_1f0,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"50\") - BigNumber(\"32\")).getString() == \"18\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x1c,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._numberString._M_dataplus._M_p != &local_1f0._numberString.field_2) {
    operator_delete(local_1f0._numberString._M_dataplus._M_p,
                    local_1f0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"50","");
  BigNumber::BigNumber(&local_210,&local_930);
  local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"60","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_950);
  operator-((BigNumber *)&local_1ad0,&local_210,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"50\") - BigNumber(\"60\")).getString() == \"-10\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x1d,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_950._M_dataplus._M_p != &local_950.field_2) {
    operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._numberString._M_dataplus._M_p != &local_210._numberString.field_2) {
    operator_delete(local_210._numberString._M_dataplus._M_p,
                    local_210._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
  }
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_970,"0","");
  BigNumber::BigNumber(&local_230,&local_970);
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"46","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_990);
  operator-((BigNumber *)&local_1ad0,&local_230,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"0\") - BigNumber(\"46\")).getString() == \"-46\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x1e,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._numberString._M_dataplus._M_p != &local_230._numberString.field_2) {
    operator_delete(local_230._numberString._M_dataplus._M_p,
                    local_230._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p != &local_970.field_2) {
    operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
  }
  local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9b0,"50","");
  BigNumber::BigNumber(&local_250,&local_9b0);
  local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d0,"50","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_9d0);
  operator-((BigNumber *)&local_1ad0,&local_250,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"50\") - BigNumber(\"50\")).getString() == \"0\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x1f,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._numberString._M_dataplus._M_p != &local_250._numberString.field_2) {
    operator_delete(local_250._numberString._M_dataplus._M_p,
                    local_250._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
    operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
  }
  local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9f0,"482847","");
  BigNumber::BigNumber(&local_270,&local_9f0);
  local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a10,"89787941","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_a10);
  operator-((BigNumber *)&local_1ad0,&local_270,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"482847\") - BigNumber(\"89787941\")).getString() == \"-89305094\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x20,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._numberString._M_dataplus._M_p != &local_270._numberString.field_2) {
    operator_delete(local_270._numberString._M_dataplus._M_p,
                    local_270._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"6828","");
  BigNumber::BigNumber(&local_290,&local_a30);
  local_a50._M_dataplus._M_p = (pointer)&local_a50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a50,"1","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_a50);
  operator-((BigNumber *)&local_1ad0,&local_290,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"6828\") - BigNumber(\"1\")).getString() == \"6827\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x21,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
    operator_delete(local_a50._M_dataplus._M_p,local_a50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._numberString._M_dataplus._M_p != &local_290._numberString.field_2) {
    operator_delete(local_290._numberString._M_dataplus._M_p,
                    local_290._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
  }
  local_a70._M_dataplus._M_p = (pointer)&local_a70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a70,"100","");
  BigNumber::BigNumber(&local_2b0,&local_a70);
  local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"50","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_a90);
  operator-((BigNumber *)&local_1ad0,&local_2b0,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"100\") - BigNumber(\"50\")).getString() == \"50\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x22,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
    operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._numberString._M_dataplus._M_p != &local_2b0._numberString.field_2) {
    operator_delete(local_2b0._numberString._M_dataplus._M_p,
                    local_2b0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  local_ab0._M_dataplus._M_p = (pointer)&local_ab0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ab0,"42","");
  BigNumber::BigNumber(&local_2d0,&local_ab0);
  local_ad0._M_dataplus._M_p = (pointer)&local_ad0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ad0,"49","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_ad0);
  operator-((BigNumber *)&local_1ad0,&local_2d0,(BigNumber *)&local_1af0);
  BigNumber::getString_abi_cxx11_(&local_1a70,(BigNumber *)&local_1ad0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1a70);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"42\") - BigNumber(\"49\")).getString() == \"-7\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x23,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) {
    operator_delete(local_ad0._M_dataplus._M_p,local_ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._numberString._M_dataplus._M_p != &local_2d0._numberString.field_2) {
    operator_delete(local_2d0._numberString._M_dataplus._M_p,
                    local_2d0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
    operator_delete(local_ab0._M_dataplus._M_p,local_ab0.field_2._M_allocated_capacity + 1);
  }
  local_af0._M_dataplus._M_p = (pointer)&local_af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_af0,"100","");
  BigNumber::BigNumber(&local_310,&local_af0);
  local_b10._M_dataplus._M_p = (pointer)&local_b10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b10,"5","");
  BigNumber::BigNumber((BigNumber *)&local_1a70,&local_b10);
  operator-(&local_2f0,&local_310,(BigNumber *)&local_1a70);
  local_1ad0._M_dataplus._M_p = (pointer)0x5f;
  bVar6 = operator==(&local_2f0,(longlong *)&local_1ad0);
  if (!bVar6) {
    __assert_fail("(BigNumber(\"100\") - BigNumber(\"5\")) == 95",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x24,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._numberString._M_dataplus._M_p != &local_2f0._numberString.field_2) {
    operator_delete(local_2f0._numberString._M_dataplus._M_p,
                    local_2f0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
    operator_delete(local_b10._M_dataplus._M_p,local_b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._numberString._M_dataplus._M_p != &local_310._numberString.field_2) {
    operator_delete(local_310._numberString._M_dataplus._M_p,
                    local_310._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
    operator_delete(local_af0._M_dataplus._M_p,local_af0.field_2._M_allocated_capacity + 1);
  }
  local_b30._M_dataplus._M_p = (pointer)&local_b30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b30,"-100","");
  BigNumber::BigNumber(&local_350,&local_b30);
  local_b50._M_dataplus._M_p = (pointer)&local_b50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b50,"-5","");
  BigNumber::BigNumber((BigNumber *)&local_1a70,&local_b50);
  operator-(&local_330,&local_350,(BigNumber *)&local_1a70);
  local_1ad0._M_dataplus._M_p = (pointer)0xffffffffffffffa1;
  bVar6 = operator==(&local_330,(longlong *)&local_1ad0);
  if (!bVar6) {
    __assert_fail("(BigNumber(\"-100\") - BigNumber(\"-5\")) == -95",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x25,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._numberString._M_dataplus._M_p != &local_330._numberString.field_2) {
    operator_delete(local_330._numberString._M_dataplus._M_p,
                    local_330._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a70._M_dataplus._M_p != paVar3) {
    operator_delete(local_1a70._M_dataplus._M_p,local_1a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
    operator_delete(local_b50._M_dataplus._M_p,local_b50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._numberString._M_dataplus._M_p != &local_350._numberString.field_2) {
    operator_delete(local_350._numberString._M_dataplus._M_p,
                    local_350._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
    operator_delete(local_b30._M_dataplus._M_p,local_b30.field_2._M_allocated_capacity + 1);
  }
  BigNumber::BigNumber((BigNumber *)&local_1a70,200);
  local_1ad0._M_dataplus._M_p = (pointer)0x28;
  BigNumber::operator-=((BigNumber *)&local_1a70,(longlong *)&local_1ad0);
  paVar2 = &local_b70._numberString.field_2;
  local_b70._numberString._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b70,local_1a70._M_dataplus._M_p,
             local_1a70._M_dataplus._M_p + local_1a70._M_string_length);
  local_1ad0._M_dataplus._M_p = (pointer)0xa0;
  bVar6 = operator==(&local_b70,(longlong *)&local_1ad0);
  if (!bVar6) {
    __assert_fail("sb1 == 160",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x28,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b70._numberString._M_dataplus._M_p != paVar2) {
    operator_delete(local_b70._numberString._M_dataplus._M_p,
                    local_b70._numberString.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_b90._numberString.field_2;
  local_b90._numberString._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b90,local_1a70._M_dataplus._M_p,
             local_1a70._M_dataplus._M_p + local_1a70._M_string_length);
  local_1af0._M_dataplus._M_p = (pointer)0xb4;
  operator-((BigNumber *)&local_1ad0,&local_b90,(longlong *)&local_1af0);
  BigNumber::operator=((BigNumber *)&local_1a70,(BigNumber *)&local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b90._numberString._M_dataplus._M_p != paVar2) {
    operator_delete(local_b90._numberString._M_dataplus._M_p,
                    local_b90._numberString.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_bb0._numberString.field_2;
  local_bb0._numberString._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_bb0,local_1a70._M_dataplus._M_p,
             local_1a70._M_dataplus._M_p + local_1a70._M_string_length);
  local_1ad0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ad0,"-20","");
  bVar6 = operator==(&local_bb0,&local_1ad0);
  if (!bVar6) {
    __assert_fail("sb1 == \"-20\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x2a,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb0._numberString._M_dataplus._M_p != paVar2) {
    operator_delete(local_bb0._numberString._M_dataplus._M_p,
                    local_bb0._numberString.field_2._M_allocated_capacity + 1);
  }
  local_1ad0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1ad0,"20","");
  BigNumber::operator-=((BigNumber *)&local_1a70,&local_1ad0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_bd0._numberString.field_2;
  local_bd0._numberString._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_bd0,local_1a70._M_dataplus._M_p,
             local_1a70._M_dataplus._M_p + local_1a70._M_string_length);
  BigNumber::BigNumber((BigNumber *)&local_1ad0,-0x28);
  bVar6 = operator==(&local_bd0,(BigNumber *)&local_1ad0);
  if (!bVar6) {
    __assert_fail("sb1 == BigNumber(-40)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x2c,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd0._numberString._M_dataplus._M_p != paVar2) {
    operator_delete(local_bd0._numberString._M_dataplus._M_p,
                    local_bd0._numberString.field_2._M_allocated_capacity + 1);
  }
  local_bf0._M_dataplus._M_p = (pointer)&local_bf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_bf0,"4","");
  BigNumber::BigNumber(&local_370,&local_bf0);
  local_c10._M_dataplus._M_p = (pointer)&local_c10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c10,"12","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_c10);
  operator*((BigNumber *)&local_1af0,&local_370,(BigNumber *)&local_1b10);
  BigNumber::getString_abi_cxx11_(&local_1ad0,(BigNumber *)&local_1af0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1ad0);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"4\") * BigNumber(\"12\")).getString() == \"48\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x2f,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_1b10.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
    operator_delete(local_c10._M_dataplus._M_p,local_c10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._numberString._M_dataplus._M_p != &local_370._numberString.field_2) {
    operator_delete(local_370._numberString._M_dataplus._M_p,
                    local_370._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
    operator_delete(local_bf0._M_dataplus._M_p,local_bf0.field_2._M_allocated_capacity + 1);
  }
  local_c30._M_dataplus._M_p = (pointer)&local_c30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c30,"3002","");
  BigNumber::BigNumber(&local_390,&local_c30);
  local_c50._M_dataplus._M_p = (pointer)&local_c50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c50,"1","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_c50);
  operator*((BigNumber *)&local_1af0,&local_390,(BigNumber *)&local_1b10);
  BigNumber::getString_abi_cxx11_(&local_1ad0,(BigNumber *)&local_1af0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1ad0);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"3002\") * BigNumber(\"1\")).getString() == \"3002\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x30,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
    operator_delete(local_c50._M_dataplus._M_p,local_c50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._numberString._M_dataplus._M_p != &local_390._numberString.field_2) {
    operator_delete(local_390._numberString._M_dataplus._M_p,
                    local_390._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
    operator_delete(local_c30._M_dataplus._M_p,local_c30.field_2._M_allocated_capacity + 1);
  }
  local_c70._M_dataplus._M_p = (pointer)&local_c70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c70,"99","");
  BigNumber::BigNumber(&local_3b0,&local_c70);
  local_c90._M_dataplus._M_p = (pointer)&local_c90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c90,"0","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_c90);
  operator*((BigNumber *)&local_1af0,&local_3b0,(BigNumber *)&local_1b10);
  BigNumber::getString_abi_cxx11_(&local_1ad0,(BigNumber *)&local_1af0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1ad0);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"99\") * BigNumber(\"0\")).getString() == \"0\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x31,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
    operator_delete(local_c90._M_dataplus._M_p,local_c90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._numberString._M_dataplus._M_p != &local_3b0._numberString.field_2) {
    operator_delete(local_3b0._numberString._M_dataplus._M_p,
                    local_3b0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
    operator_delete(local_c70._M_dataplus._M_p,local_c70.field_2._M_allocated_capacity + 1);
  }
  local_cb0._M_dataplus._M_p = (pointer)&local_cb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cb0,"-5","");
  BigNumber::BigNumber(&local_3d0,&local_cb0);
  local_cd0._M_dataplus._M_p = (pointer)&local_cd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cd0,"5","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_cd0);
  operator*((BigNumber *)&local_1af0,&local_3d0,(BigNumber *)&local_1b10);
  BigNumber::getString_abi_cxx11_(&local_1ad0,(BigNumber *)&local_1af0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1ad0);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"-5\") * BigNumber(\"5\")).getString() == \"-25\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x32,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
    operator_delete(local_cd0._M_dataplus._M_p,local_cd0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._numberString._M_dataplus._M_p != &local_3d0._numberString.field_2) {
    operator_delete(local_3d0._numberString._M_dataplus._M_p,
                    local_3d0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
    operator_delete(local_cb0._M_dataplus._M_p,local_cb0.field_2._M_allocated_capacity + 1);
  }
  local_cf0._M_dataplus._M_p = (pointer)&local_cf0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cf0,"-33","");
  BigNumber::BigNumber(&local_3f0,&local_cf0);
  local_d10._M_dataplus._M_p = (pointer)&local_d10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d10,"-2","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_d10);
  operator*((BigNumber *)&local_1af0,&local_3f0,(BigNumber *)&local_1b10);
  BigNumber::getString_abi_cxx11_(&local_1ad0,(BigNumber *)&local_1af0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1ad0);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"-33\") * BigNumber(\"-2\")).getString() == \"66\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x33,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
    operator_delete(local_d10._M_dataplus._M_p,local_d10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._numberString._M_dataplus._M_p != &local_3f0._numberString.field_2) {
    operator_delete(local_3f0._numberString._M_dataplus._M_p,
                    local_3f0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
    operator_delete(local_cf0._M_dataplus._M_p,local_cf0.field_2._M_allocated_capacity + 1);
  }
  local_d30._M_dataplus._M_p = (pointer)&local_d30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d30,"283","");
  BigNumber::BigNumber(&local_410,&local_d30);
  local_d50._M_dataplus._M_p = (pointer)&local_d50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d50,"382871","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_d50);
  operator*((BigNumber *)&local_1af0,&local_410,(BigNumber *)&local_1b10);
  BigNumber::getString_abi_cxx11_(&local_1ad0,(BigNumber *)&local_1af0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1ad0);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"283\") * BigNumber(\"382871\")).getString() == \"108352493\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x34,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ad0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1ad0._M_dataplus._M_p,local_1ad0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
    operator_delete(local_d50._M_dataplus._M_p,local_d50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._numberString._M_dataplus._M_p != &local_410._numberString.field_2) {
    operator_delete(local_410._numberString._M_dataplus._M_p,
                    local_410._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
    operator_delete(local_d30._M_dataplus._M_p,local_d30.field_2._M_allocated_capacity + 1);
  }
  BigNumber::BigNumber((BigNumber *)&local_1ad0,4);
  local_1af0._M_dataplus._M_p = (pointer)0x6;
  BigNumber::operator*=((BigNumber *)&local_1ad0,(longlong *)&local_1af0);
  paVar3 = &local_d70._numberString.field_2;
  local_d70._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d70,local_1ad0._M_dataplus._M_p,
             local_1ad0._M_dataplus._M_p + local_1ad0._M_string_length);
  local_1af0._M_dataplus._M_p = (pointer)&local_1af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1af0,"24","");
  bVar6 = operator==(&local_d70,&local_1af0);
  if (!bVar6) {
    __assert_fail("ml1 == \"24\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x37,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d70._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_d70._numberString._M_dataplus._M_p,
                    local_d70._numberString.field_2._M_allocated_capacity + 1);
  }
  BigNumber::BigNumber(&local_430,5);
  local_1b10._M_dataplus._M_p = (pointer)0x6;
  operator*((BigNumber *)&local_1af0,&local_430,(longlong *)&local_1b10);
  BigNumber::operator=((BigNumber *)&local_1ad0,(BigNumber *)&local_1af0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._numberString._M_dataplus._M_p != &local_430._numberString.field_2) {
    operator_delete(local_430._numberString._M_dataplus._M_p,
                    local_430._numberString.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_d90._numberString.field_2;
  local_d90._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d90,local_1ad0._M_dataplus._M_p,
             local_1ad0._M_dataplus._M_p + local_1ad0._M_string_length);
  local_1af0._M_dataplus._M_p = (pointer)0x1e;
  bVar6 = operator==(&local_d90,(longlong *)&local_1af0);
  if (!bVar6) {
    __assert_fail("ml1 == 30",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x39,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d90._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_d90._numberString._M_dataplus._M_p,
                    local_d90._numberString.field_2._M_allocated_capacity + 1);
  }
  local_1af0._M_dataplus._M_p = (pointer)&local_1af0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1af0,"5000","");
  BigNumber::operator*=((BigNumber *)&local_1ad0,&local_1af0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_db0._numberString.field_2;
  local_db0._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_db0,local_1ad0._M_dataplus._M_p,
             local_1ad0._M_dataplus._M_p + local_1ad0._M_string_length);
  local_1af0._M_dataplus._M_p = (pointer)0x249f0;
  bVar6 = operator==(&local_db0,(longlong *)&local_1af0);
  if (!bVar6) {
    __assert_fail("ml1 == 150000",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x3b,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_db0._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_db0._numberString._M_dataplus._M_p,
                    local_db0._numberString.field_2._M_allocated_capacity + 1);
  }
  local_dd0._M_dataplus._M_p = (pointer)&local_dd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_dd0,"25","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_dd0);
  local_df0._M_dataplus._M_p = (pointer)&local_df0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_df0,"5","");
  BigNumber::BigNumber(&local_470,&local_df0);
  BigNumber::divide(&local_450,(BigNumber *)&local_1af0,&local_470);
  local_1b10._M_dataplus._M_p = (pointer)0x5;
  bVar6 = operator==(&local_450,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"25\").divide(BigNumber(\"5\")) == 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x3e,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._numberString._M_dataplus._M_p != &local_450._numberString.field_2) {
    operator_delete(local_450._numberString._M_dataplus._M_p,
                    local_450._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._numberString._M_dataplus._M_p != &local_470._numberString.field_2) {
    operator_delete(local_470._numberString._M_dataplus._M_p,
                    local_470._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_df0._M_dataplus._M_p != &local_df0.field_2) {
    operator_delete(local_df0._M_dataplus._M_p,local_df0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dd0._M_dataplus._M_p != &local_dd0.field_2) {
    operator_delete(local_dd0._M_dataplus._M_p,local_dd0.field_2._M_allocated_capacity + 1);
  }
  local_e10._M_dataplus._M_p = (pointer)&local_e10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e10,"48","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_e10);
  local_e30._M_dataplus._M_p = (pointer)&local_e30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e30,"6","");
  BigNumber::BigNumber(&local_4b0,&local_e30);
  BigNumber::divide(&local_490,(BigNumber *)&local_1af0,&local_4b0);
  local_1b10._M_dataplus._M_p = (pointer)0x8;
  bVar6 = operator==(&local_490,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"48\").divide(BigNumber(\"6\")) == 8",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x3f,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._numberString._M_dataplus._M_p != &local_490._numberString.field_2) {
    operator_delete(local_490._numberString._M_dataplus._M_p,
                    local_490._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._numberString._M_dataplus._M_p != &local_4b0._numberString.field_2) {
    operator_delete(local_4b0._numberString._M_dataplus._M_p,
                    local_4b0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e30._M_dataplus._M_p != &local_e30.field_2) {
    operator_delete(local_e30._M_dataplus._M_p,local_e30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e10._M_dataplus._M_p != &local_e10.field_2) {
    operator_delete(local_e10._M_dataplus._M_p,local_e10.field_2._M_allocated_capacity + 1);
  }
  local_e50._M_dataplus._M_p = (pointer)&local_e50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e50,"100","");
  BigNumber::BigNumber((BigNumber *)&local_1af0,&local_e50);
  local_e70._M_dataplus._M_p = (pointer)&local_e70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e70,"5","");
  BigNumber::BigNumber(&local_4f0,&local_e70);
  BigNumber::divide(&local_4d0,(BigNumber *)&local_1af0,&local_4f0);
  local_1b10._M_dataplus._M_p = (pointer)0x14;
  bVar6 = operator==(&local_4d0,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"100\").divide(BigNumber(\"5\")) == 20",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x40,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._numberString._M_dataplus._M_p != &local_4d0._numberString.field_2) {
    operator_delete(local_4d0._numberString._M_dataplus._M_p,
                    local_4d0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._numberString._M_dataplus._M_p != &local_4f0._numberString.field_2) {
    operator_delete(local_4f0._numberString._M_dataplus._M_p,
                    local_4f0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e70._M_dataplus._M_p != &local_e70.field_2) {
    operator_delete(local_e70._M_dataplus._M_p,local_e70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
    operator_delete(local_1af0._M_dataplus._M_p,local_1af0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e50._M_dataplus._M_p != &local_e50.field_2) {
    operator_delete(local_e50._M_dataplus._M_p,local_e50.field_2._M_allocated_capacity + 1);
  }
  BigNumber::BigNumber((BigNumber *)&local_1af0,100);
  local_1b10._M_dataplus._M_p = (pointer)0x19;
  BigNumber::operator/=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  paVar3 = &local_e90._numberString.field_2;
  local_e90._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_1af0._M_dataplus._M_p,
             local_1af0._M_dataplus._M_p + local_1af0._M_string_length);
  local_1b10._M_dataplus._M_p = (pointer)0x4;
  bVar6 = operator==(&local_e90,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("dv1 == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x43,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_e90._numberString._M_dataplus._M_p,
                    local_e90._numberString.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_eb0._numberString.field_2;
  local_eb0._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_eb0,local_1af0._M_dataplus._M_p,
             local_1af0._M_dataplus._M_p + local_1af0._M_string_length);
  operator/((BigNumber *)&local_1b10,&local_eb0,(BigNumber *)&local_1af0);
  BigNumber::operator=((BigNumber *)&local_1af0,(BigNumber *)&local_1b10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb0._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_eb0._numberString._M_dataplus._M_p,
                    local_eb0._numberString.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_ed0._numberString.field_2;
  local_ed0._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ed0,local_1af0._M_dataplus._M_p,
             local_1af0._M_dataplus._M_p + local_1af0._M_string_length);
  local_1b10._M_dataplus._M_p = (pointer)0x1;
  bVar6 = operator==(&local_ed0,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("dv1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x45,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed0._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_ed0._numberString._M_dataplus._M_p,
                    local_ed0._numberString.field_2._M_allocated_capacity + 1);
  }
  local_1b10._M_dataplus._M_p = (pointer)0x1;
  BigNumber::operator/=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  paVar3 = &local_ef0._numberString.field_2;
  local_ef0._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_ef0,local_1af0._M_dataplus._M_p,
             local_1af0._M_dataplus._M_p + local_1af0._M_string_length);
  local_1b10._M_dataplus._M_p = (pointer)0x1;
  bVar6 = operator==(&local_ef0,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("dv1 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x47,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef0._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_ef0._numberString._M_dataplus._M_p,
                    local_ef0._numberString.field_2._M_allocated_capacity + 1);
  }
  local_1b10._M_dataplus._M_p = (pointer)0xfffffffffffffffb;
  BigNumber::operator=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  local_1b10._M_dataplus._M_p = (pointer)0x5;
  BigNumber::operator/=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  paVar3 = &local_f10._numberString.field_2;
  local_f10._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f10,local_1af0._M_dataplus._M_p,
             local_1af0._M_dataplus._M_p + local_1af0._M_string_length);
  local_1b10._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  bVar6 = operator==(&local_f10,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("dv1 == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x4a,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f10._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_f10._numberString._M_dataplus._M_p,
                    local_f10._numberString.field_2._M_allocated_capacity + 1);
  }
  local_1b10._M_dataplus._M_p = (pointer)0xbb8;
  BigNumber::operator=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  local_1b10._M_dataplus._M_p = (pointer)0x12c;
  BigNumber::operator/=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  paVar3 = &local_f30._numberString.field_2;
  local_f30._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f30,local_1af0._M_dataplus._M_p,
             local_1af0._M_dataplus._M_p + local_1af0._M_string_length);
  local_1b10._M_dataplus._M_p = (pointer)0xa;
  bVar6 = operator==(&local_f30,(longlong *)&local_1b10);
  if (!bVar6) {
    __assert_fail("dv1 == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x4d,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f30._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_f30._numberString._M_dataplus._M_p,
                    local_f30._numberString.field_2._M_allocated_capacity + 1);
  }
  local_1b10._M_dataplus._M_p = (pointer)0x638d;
  BigNumber::operator=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  local_1b10._M_dataplus._M_p = (pointer)0x5;
  BigNumber::operator/=((BigNumber *)&local_1af0,(longlong *)&local_1b10);
  paVar3 = &local_f50._numberString.field_2;
  local_f50._numberString._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f50,local_1af0._M_dataplus._M_p,
             local_1af0._M_dataplus._M_p + local_1af0._M_string_length);
  local_1b10._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b10,"5097","");
  bVar6 = operator==(&local_f50,&local_1b10);
  if (!bVar6) {
    __assert_fail("dv1 == \"5097\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x50,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._numberString._M_dataplus._M_p != paVar3) {
    operator_delete(local_f50._numberString._M_dataplus._M_p,
                    local_f50._numberString.field_2._M_allocated_capacity + 1);
  }
  local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f70,"2","");
  BigNumber::BigNumber((BigNumber *)&local_1a90,&local_f70);
  BigNumber::pow((BigNumber *)&local_1ab0,__x,in_XMM1_Qa);
  BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"2\").pow(3)).getString() == \"8\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x53,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_1ab0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_1a90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a90._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p,local_f70.field_2._M_allocated_capacity + 1);
  }
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,"1","");
  BigNumber::BigNumber((BigNumber *)&local_1a90,&local_f90);
  BigNumber::pow((BigNumber *)&local_1ab0,__x_00,in_XMM1_Qa);
  BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"1\").pow(38)).getString() == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x54,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a90._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p,local_f90.field_2._M_allocated_capacity + 1);
  }
  local_fb0._M_dataplus._M_p = (pointer)&local_fb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fb0,"5","");
  BigNumber::BigNumber((BigNumber *)&local_1a90,&local_fb0);
  BigNumber::pow((BigNumber *)&local_1ab0,__x_01,in_XMM1_Qa);
  BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"5\").pow(2)).getString() == \"25\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x55,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a90._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb0._M_dataplus._M_p != &local_fb0.field_2) {
    operator_delete(local_fb0._M_dataplus._M_p,local_fb0.field_2._M_allocated_capacity + 1);
  }
  local_fd0._M_dataplus._M_p = (pointer)&local_fd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fd0,"10","");
  BigNumber::BigNumber((BigNumber *)&local_1a90,&local_fd0);
  BigNumber::pow((BigNumber *)&local_1ab0,__x_02,in_XMM1_Qa);
  BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"10\").pow(10)).getString() == \"10000000000\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x56,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a90._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd0._M_dataplus._M_p != &local_fd0.field_2) {
    operator_delete(local_fd0._M_dataplus._M_p,local_fd0.field_2._M_allocated_capacity + 1);
  }
  local_ff0._M_dataplus._M_p = (pointer)&local_ff0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ff0,"5","");
  BigNumber::BigNumber((BigNumber *)&local_1a90,&local_ff0);
  BigNumber::pow((BigNumber *)&local_1ab0,__x_03,in_XMM1_Qa);
  BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"5\").pow(1)).getString() == \"5\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x57,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a90._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._M_dataplus._M_p != &local_ff0.field_2) {
    operator_delete(local_ff0._M_dataplus._M_p,local_ff0.field_2._M_allocated_capacity + 1);
  }
  local_1010._M_dataplus._M_p = (pointer)&local_1010.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1010,"5","");
  BigNumber::BigNumber((BigNumber *)&local_1a90,&local_1010);
  BigNumber::pow((BigNumber *)&local_1ab0,__x_04,in_XMM1_Qa);
  BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"5\").pow(0)).getString() == \"1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x58,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a90._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
    operator_delete(local_1010._M_dataplus._M_p,local_1010.field_2._M_allocated_capacity + 1);
  }
  local_1030._M_dataplus._M_p = (pointer)&local_1030.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1030,"-5","");
  BigNumber::BigNumber((BigNumber *)&local_1a90,&local_1030);
  BigNumber::pow((BigNumber *)&local_1ab0,__x_05,in_XMM1_Qa);
  BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
  iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
  if (iVar7 != 0) {
    __assert_fail("(BigNumber(\"-5\").pow(2)).getString() == \"25\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x59,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1ab0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a90._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1030._M_dataplus._M_p != &local_1030.field_2) {
    operator_delete(local_1030._M_dataplus._M_p,local_1030.field_2._M_allocated_capacity + 1);
  }
  local_1050._M_dataplus._M_p = (pointer)&local_1050.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1050,"4","");
  BigNumber::BigNumber(&local_510,&local_1050);
  local_1070._M_dataplus._M_p = (pointer)&local_1070.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1070,"4","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1070);
  bVar6 = operator==(&local_510,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"4\") == BigNumber(\"4\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x5c,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1070._M_dataplus._M_p != &local_1070.field_2) {
    operator_delete(local_1070._M_dataplus._M_p,local_1070.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._numberString._M_dataplus._M_p != &local_510._numberString.field_2) {
    operator_delete(local_510._numberString._M_dataplus._M_p,
                    local_510._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1050._M_dataplus._M_p != &local_1050.field_2) {
    operator_delete(local_1050._M_dataplus._M_p,local_1050.field_2._M_allocated_capacity + 1);
  }
  local_1090._M_dataplus._M_p = (pointer)&local_1090.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1090,"-3","");
  BigNumber::BigNumber(&local_530,&local_1090);
  local_10b0._M_dataplus._M_p = (pointer)&local_10b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b0,"-3","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_10b0);
  bVar6 = operator==(&local_530,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"-3\") == BigNumber(\"-3\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x5d,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
    operator_delete(local_10b0._M_dataplus._M_p,local_10b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._numberString._M_dataplus._M_p != &local_530._numberString.field_2) {
    operator_delete(local_530._numberString._M_dataplus._M_p,
                    local_530._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
    operator_delete(local_1090._M_dataplus._M_p,local_1090.field_2._M_allocated_capacity + 1);
  }
  local_10d0._M_dataplus._M_p = (pointer)&local_10d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10d0,"0","");
  BigNumber::BigNumber(&local_550,&local_10d0);
  local_10f0._M_dataplus._M_p = (pointer)&local_10f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10f0,"0","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_10f0);
  bVar6 = operator==(&local_550,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"0\") == BigNumber(\"0\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x5e,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f0._M_dataplus._M_p != &local_10f0.field_2) {
    operator_delete(local_10f0._M_dataplus._M_p,local_10f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._numberString._M_dataplus._M_p != &local_550._numberString.field_2) {
    operator_delete(local_550._numberString._M_dataplus._M_p,
                    local_550._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d0._M_dataplus._M_p != &local_10d0.field_2) {
    operator_delete(local_10d0._M_dataplus._M_p,local_10d0.field_2._M_allocated_capacity + 1);
  }
  local_1110._M_dataplus._M_p = (pointer)&local_1110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1110,"938283828178273","");
  BigNumber::BigNumber(&local_570,&local_1110);
  local_1130._M_dataplus._M_p = (pointer)&local_1130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1130,"938283828178273","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1130);
  bVar6 = operator==(&local_570,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"938283828178273\") == BigNumber(\"938283828178273\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x5f,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p,local_1130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._numberString._M_dataplus._M_p != &local_570._numberString.field_2) {
    operator_delete(local_570._numberString._M_dataplus._M_p,
                    local_570._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1110._M_dataplus._M_p != &local_1110.field_2) {
    operator_delete(local_1110._M_dataplus._M_p,local_1110.field_2._M_allocated_capacity + 1);
  }
  local_1150._M_dataplus._M_p = (pointer)&local_1150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1150,"5","");
  BigNumber::BigNumber(&local_590,&local_1150);
  local_1170._M_dataplus._M_p = (pointer)&local_1170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1170,"2","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1170);
  bVar6 = operator>(&local_590,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"5\") > BigNumber(\"2\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x62,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1170._M_dataplus._M_p != &local_1170.field_2) {
    operator_delete(local_1170._M_dataplus._M_p,local_1170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._numberString._M_dataplus._M_p != &local_590._numberString.field_2) {
    operator_delete(local_590._numberString._M_dataplus._M_p,
                    local_590._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1150._M_dataplus._M_p != &local_1150.field_2) {
    operator_delete(local_1150._M_dataplus._M_p,local_1150.field_2._M_allocated_capacity + 1);
  }
  local_1190._M_dataplus._M_p = (pointer)&local_1190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1190,"30","");
  BigNumber::BigNumber(&local_5b0,&local_1190);
  local_11b0._M_dataplus._M_p = (pointer)&local_11b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11b0,"-40","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_11b0);
  bVar6 = operator>(&local_5b0,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"30\") > BigNumber(\"-40\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  99,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b0._M_dataplus._M_p != &local_11b0.field_2) {
    operator_delete(local_11b0._M_dataplus._M_p,local_11b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._numberString._M_dataplus._M_p != &local_5b0._numberString.field_2) {
    operator_delete(local_5b0._numberString._M_dataplus._M_p,
                    local_5b0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1190._M_dataplus._M_p != &local_1190.field_2) {
    operator_delete(local_1190._M_dataplus._M_p,local_1190.field_2._M_allocated_capacity + 1);
  }
  local_11d0._M_dataplus._M_p = (pointer)&local_11d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11d0,"-5","");
  BigNumber::BigNumber(&local_5d0,&local_11d0);
  local_11f0._M_dataplus._M_p = (pointer)&local_11f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11f0,"-10","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_11f0);
  bVar6 = operator>(&local_5d0,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"-5\") > BigNumber(\"-10\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  100,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11f0._M_dataplus._M_p != &local_11f0.field_2) {
    operator_delete(local_11f0._M_dataplus._M_p,local_11f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._numberString._M_dataplus._M_p != &local_5d0._numberString.field_2) {
    operator_delete(local_5d0._numberString._M_dataplus._M_p,
                    local_5d0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11d0._M_dataplus._M_p != &local_11d0.field_2) {
    operator_delete(local_11d0._M_dataplus._M_p,local_11d0.field_2._M_allocated_capacity + 1);
  }
  local_1210._M_dataplus._M_p = (pointer)&local_1210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1210,"0","");
  BigNumber::BigNumber(&local_5f0,&local_1210);
  local_1230._M_dataplus._M_p = (pointer)&local_1230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1230,"-1","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1230);
  bVar6 = operator>(&local_5f0,(BigNumber *)&local_1b10);
  if (!bVar6) {
    __assert_fail("BigNumber(\"0\") > BigNumber(\"-1\")",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x65,"int main()");
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b10._M_dataplus._M_p != paVar2) {
    operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1230._M_dataplus._M_p != &local_1230.field_2) {
    operator_delete(local_1230._M_dataplus._M_p,local_1230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._numberString._M_dataplus._M_p != &local_5f0._numberString.field_2) {
    operator_delete(local_5f0._numberString._M_dataplus._M_p,
                    local_5f0._numberString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1210._M_dataplus._M_p != &local_1210.field_2) {
    operator_delete(local_1210._M_dataplus._M_p,local_1210.field_2._M_allocated_capacity + 1);
  }
  local_1250._M_dataplus._M_p = (pointer)&local_1250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1250,"10","");
  BigNumber::BigNumber(&local_610,&local_1250);
  local_1270._M_dataplus._M_p = (pointer)&local_1270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1270,"20","");
  BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1270);
  bVar6 = operator<(&local_610,(BigNumber *)&local_1b10);
  if (bVar6) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1270._M_dataplus._M_p != &local_1270.field_2) {
      operator_delete(local_1270._M_dataplus._M_p,local_1270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._numberString._M_dataplus._M_p != &local_610._numberString.field_2) {
      operator_delete(local_610._numberString._M_dataplus._M_p,
                      local_610._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1250._M_dataplus._M_p != &local_1250.field_2) {
      operator_delete(local_1250._M_dataplus._M_p,local_1250.field_2._M_allocated_capacity + 1);
    }
    local_1290._M_dataplus._M_p = (pointer)&local_1290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1290,"-5","");
    BigNumber::BigNumber(&local_630,&local_1290);
    local_12b0._M_dataplus._M_p = (pointer)&local_12b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b0,"0","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_12b0);
    bVar6 = operator<(&local_630,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"-5\") < BigNumber(\"0\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x69,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12b0._M_dataplus._M_p != &local_12b0.field_2) {
      operator_delete(local_12b0._M_dataplus._M_p,local_12b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._numberString._M_dataplus._M_p != &local_630._numberString.field_2) {
      operator_delete(local_630._numberString._M_dataplus._M_p,
                      local_630._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
      operator_delete(local_1290._M_dataplus._M_p,local_1290.field_2._M_allocated_capacity + 1);
    }
    local_12d0._M_dataplus._M_p = (pointer)&local_12d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_12d0,"30","");
    BigNumber::BigNumber(&local_650,&local_12d0);
    local_12f0._M_dataplus._M_p = (pointer)&local_12f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_12f0,"30000","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_12f0);
    bVar6 = operator<(&local_650,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"30\") < BigNumber(\"30000\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x6a,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12f0._M_dataplus._M_p != &local_12f0.field_2) {
      operator_delete(local_12f0._M_dataplus._M_p,local_12f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._numberString._M_dataplus._M_p != &local_650._numberString.field_2) {
      operator_delete(local_650._numberString._M_dataplus._M_p,
                      local_650._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12d0._M_dataplus._M_p != &local_12d0.field_2) {
      operator_delete(local_12d0._M_dataplus._M_p,local_12d0.field_2._M_allocated_capacity + 1);
    }
    local_1310._M_dataplus._M_p = (pointer)&local_1310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1310,"5","");
    BigNumber::BigNumber(&local_670,&local_1310);
    local_1330._M_dataplus._M_p = (pointer)&local_1330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1330,"0","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1330);
    bVar6 = operator>=(&local_670,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"5\") >= BigNumber(\"0\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x6d,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1330._M_dataplus._M_p != &local_1330.field_2) {
      operator_delete(local_1330._M_dataplus._M_p,local_1330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._numberString._M_dataplus._M_p != &local_670._numberString.field_2) {
      operator_delete(local_670._numberString._M_dataplus._M_p,
                      local_670._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1310._M_dataplus._M_p != &local_1310.field_2) {
      operator_delete(local_1310._M_dataplus._M_p,local_1310.field_2._M_allocated_capacity + 1);
    }
    local_1350._M_dataplus._M_p = (pointer)&local_1350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1350,"-5","");
    BigNumber::BigNumber(&local_690,&local_1350);
    local_1370._M_dataplus._M_p = (pointer)&local_1370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1370,"-5","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1370);
    bVar6 = operator>=(&local_690,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"-5\") >= BigNumber(\"-5\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x6e,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1370._M_dataplus._M_p != &local_1370.field_2) {
      operator_delete(local_1370._M_dataplus._M_p,local_1370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_690._numberString._M_dataplus._M_p != &local_690._numberString.field_2) {
      operator_delete(local_690._numberString._M_dataplus._M_p,
                      local_690._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1350._M_dataplus._M_p != &local_1350.field_2) {
      operator_delete(local_1350._M_dataplus._M_p,local_1350.field_2._M_allocated_capacity + 1);
    }
    local_1390._M_dataplus._M_p = (pointer)&local_1390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1390,"-5","");
    BigNumber::BigNumber(&local_6b0,&local_1390);
    local_13b0._M_dataplus._M_p = (pointer)&local_13b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13b0,"-10","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_13b0);
    bVar6 = operator>=(&local_6b0,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"-5\") >= BigNumber(\"-10\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x6f,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13b0._M_dataplus._M_p != &local_13b0.field_2) {
      operator_delete(local_13b0._M_dataplus._M_p,local_13b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0._numberString._M_dataplus._M_p != &local_6b0._numberString.field_2) {
      operator_delete(local_6b0._numberString._M_dataplus._M_p,
                      local_6b0._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1390._M_dataplus._M_p != &local_1390.field_2) {
      operator_delete(local_1390._M_dataplus._M_p,local_1390.field_2._M_allocated_capacity + 1);
    }
    local_13d0._M_dataplus._M_p = (pointer)&local_13d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13d0,"0","");
    BigNumber::BigNumber(&local_6d0,&local_13d0);
    local_13f0._M_dataplus._M_p = (pointer)&local_13f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_13f0,"0","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_13f0);
    bVar6 = operator>=(&local_6d0,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"0\") >= BigNumber(\"0\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x70,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13f0._M_dataplus._M_p != &local_13f0.field_2) {
      operator_delete(local_13f0._M_dataplus._M_p,local_13f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d0._numberString._M_dataplus._M_p != &local_6d0._numberString.field_2) {
      operator_delete(local_6d0._numberString._M_dataplus._M_p,
                      local_6d0._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_13d0._M_dataplus._M_p != &local_13d0.field_2) {
      operator_delete(local_13d0._M_dataplus._M_p,local_13d0.field_2._M_allocated_capacity + 1);
    }
    local_1410._M_dataplus._M_p = (pointer)&local_1410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1410,"32","");
    BigNumber::BigNumber(&local_6f0,&local_1410);
    local_1430._M_dataplus._M_p = (pointer)&local_1430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1430,"-32","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1430);
    bVar6 = operator>=(&local_6f0,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"32\") >= BigNumber(\"-32\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x71,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1430._M_dataplus._M_p != &local_1430.field_2) {
      operator_delete(local_1430._M_dataplus._M_p,local_1430.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6f0._numberString._M_dataplus._M_p != &local_6f0._numberString.field_2) {
      operator_delete(local_6f0._numberString._M_dataplus._M_p,
                      local_6f0._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1410._M_dataplus._M_p != &local_1410.field_2) {
      operator_delete(local_1410._M_dataplus._M_p,local_1410.field_2._M_allocated_capacity + 1);
    }
    local_1450._M_dataplus._M_p = (pointer)&local_1450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1450,"2","");
    BigNumber::BigNumber(&local_710,&local_1450);
    local_1470._M_dataplus._M_p = (pointer)&local_1470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1470,"0001","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1470);
    bVar6 = operator>=(&local_710,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"2\") >= BigNumber(\"0001\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x72,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1470._M_dataplus._M_p != &local_1470.field_2) {
      operator_delete(local_1470._M_dataplus._M_p,local_1470.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_710._numberString._M_dataplus._M_p != &local_710._numberString.field_2) {
      operator_delete(local_710._numberString._M_dataplus._M_p,
                      local_710._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1450._M_dataplus._M_p != &local_1450.field_2) {
      operator_delete(local_1450._M_dataplus._M_p,local_1450.field_2._M_allocated_capacity + 1);
    }
    local_1490._M_dataplus._M_p = (pointer)&local_1490.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1490,"5","");
    BigNumber::BigNumber(&local_730,&local_1490);
    local_14b0._M_dataplus._M_p = (pointer)&local_14b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_14b0,"10","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_14b0);
    bVar6 = operator<=(&local_730,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"5\") <= BigNumber(\"10\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x75,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14b0._M_dataplus._M_p != &local_14b0.field_2) {
      operator_delete(local_14b0._M_dataplus._M_p,local_14b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730._numberString._M_dataplus._M_p != &local_730._numberString.field_2) {
      operator_delete(local_730._numberString._M_dataplus._M_p,
                      local_730._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1490._M_dataplus._M_p != &local_1490.field_2) {
      operator_delete(local_1490._M_dataplus._M_p,local_1490.field_2._M_allocated_capacity + 1);
    }
    local_14d0._M_dataplus._M_p = (pointer)&local_14d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_14d0,"0","");
    BigNumber::BigNumber(&local_750,&local_14d0);
    local_14f0._M_dataplus._M_p = (pointer)&local_14f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_14f0,"0","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_14f0);
    bVar6 = operator<=(&local_750,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"0\") <= BigNumber(\"0\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x76,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14f0._M_dataplus._M_p != &local_14f0.field_2) {
      operator_delete(local_14f0._M_dataplus._M_p,local_14f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_750._numberString._M_dataplus._M_p != &local_750._numberString.field_2) {
      operator_delete(local_750._numberString._M_dataplus._M_p,
                      local_750._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14d0._M_dataplus._M_p != &local_14d0.field_2) {
      operator_delete(local_14d0._M_dataplus._M_p,local_14d0.field_2._M_allocated_capacity + 1);
    }
    local_1510._M_dataplus._M_p = (pointer)&local_1510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1510,"-5","");
    BigNumber::BigNumber(&local_770,&local_1510);
    local_1530._M_dataplus._M_p = (pointer)&local_1530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1530,"0","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1530);
    bVar6 = operator<=(&local_770,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"-5\") <= BigNumber(\"0\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x77,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1530._M_dataplus._M_p != &local_1530.field_2) {
      operator_delete(local_1530._M_dataplus._M_p,local_1530.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_770._numberString._M_dataplus._M_p != &local_770._numberString.field_2) {
      operator_delete(local_770._numberString._M_dataplus._M_p,
                      local_770._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1510._M_dataplus._M_p != &local_1510.field_2) {
      operator_delete(local_1510._M_dataplus._M_p,local_1510.field_2._M_allocated_capacity + 1);
    }
    local_1550._M_dataplus._M_p = (pointer)&local_1550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1550,"30","");
    BigNumber::BigNumber(&local_790,&local_1550);
    local_1570._M_dataplus._M_p = (pointer)&local_1570.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1570,"30","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1570);
    bVar6 = operator<=(&local_790,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"30\") <= BigNumber(\"30\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x78,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1570._M_dataplus._M_p != &local_1570.field_2) {
      operator_delete(local_1570._M_dataplus._M_p,local_1570.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_790._numberString._M_dataplus._M_p != &local_790._numberString.field_2) {
      operator_delete(local_790._numberString._M_dataplus._M_p,
                      local_790._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
      operator_delete(local_1550._M_dataplus._M_p,local_1550.field_2._M_allocated_capacity + 1);
    }
    local_1590._M_dataplus._M_p = (pointer)&local_1590.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1590,"400","");
    BigNumber::BigNumber(&local_7b0,&local_1590);
    local_15b0._M_dataplus._M_p = (pointer)&local_15b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15b0,"392342","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_15b0);
    bVar6 = operator<=(&local_7b0,(BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"400\") <= BigNumber(\"392342\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x79,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15b0._M_dataplus._M_p != &local_15b0.field_2) {
      operator_delete(local_15b0._M_dataplus._M_p,local_15b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0._numberString._M_dataplus._M_p != &local_7b0._numberString.field_2) {
      operator_delete(local_7b0._numberString._M_dataplus._M_p,
                      local_7b0._numberString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1590._M_dataplus._M_p != &local_1590.field_2) {
      operator_delete(local_1590._M_dataplus._M_p,local_1590.field_2._M_allocated_capacity + 1);
    }
    local_15d0._M_dataplus._M_p = (pointer)&local_15d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15d0,"423","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_15d0);
    uVar8 = BigNumber::operator[]((BigNumber *)&local_1b10,1);
    if (uVar8 != 2) {
      __assert_fail("BigNumber(\"423\")[1] == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x7c,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15d0._M_dataplus._M_p != &local_15d0.field_2) {
      operator_delete(local_15d0._M_dataplus._M_p,local_15d0.field_2._M_allocated_capacity + 1);
    }
    local_15f0._M_dataplus._M_p = (pointer)&local_15f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_15f0,"0","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_15f0);
    uVar8 = BigNumber::operator[]((BigNumber *)&local_1b10,0);
    if (uVar8 != 0) {
      __assert_fail("BigNumber(\"0\")[0] == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x7d,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15f0._M_dataplus._M_p != &local_15f0.field_2) {
      operator_delete(local_15f0._M_dataplus._M_p,local_15f0.field_2._M_allocated_capacity + 1);
    }
    local_1610._M_dataplus._M_p = (pointer)&local_1610.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1610,"-5","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1610);
    uVar8 = BigNumber::operator[]((BigNumber *)&local_1b10,1);
    if (uVar8 != 5) {
      __assert_fail("BigNumber(\"-5\")[1] == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x7e,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1610._M_dataplus._M_p != &local_1610.field_2) {
      operator_delete(local_1610._M_dataplus._M_p,local_1610.field_2._M_allocated_capacity + 1);
    }
    local_1630._M_dataplus._M_p = (pointer)&local_1630.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1630,"426","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1630);
    bVar6 = BigNumber::isEven((BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"426\").isEven()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x81,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1630._M_dataplus._M_p != &local_1630.field_2) {
      operator_delete(local_1630._M_dataplus._M_p,local_1630.field_2._M_allocated_capacity + 1);
    }
    local_1650._M_dataplus._M_p = (pointer)&local_1650.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1650,"-20","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1650);
    bVar6 = BigNumber::isEven((BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"-20\").isEven()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x82,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1650._M_dataplus._M_p != &local_1650.field_2) {
      operator_delete(local_1650._M_dataplus._M_p,local_1650.field_2._M_allocated_capacity + 1);
    }
    local_1670._M_dataplus._M_p = (pointer)&local_1670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1670,"83","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1670);
    bVar6 = BigNumber::isOdd((BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"83\").isOdd()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x85,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1670._M_dataplus._M_p != &local_1670.field_2) {
      operator_delete(local_1670._M_dataplus._M_p,local_1670.field_2._M_allocated_capacity + 1);
    }
    local_1690._M_dataplus._M_p = (pointer)&local_1690.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1690,"-27","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1690);
    bVar6 = BigNumber::isOdd((BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"-27\").isOdd()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x86,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1690._M_dataplus._M_p != &local_1690.field_2) {
      operator_delete(local_1690._M_dataplus._M_p,local_1690.field_2._M_allocated_capacity + 1);
    }
    local_16b0._M_dataplus._M_p = (pointer)&local_16b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_16b0,"38","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_16b0);
    bVar6 = BigNumber::isPositive((BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"38\").isPositive()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x89,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16b0._M_dataplus._M_p != &local_16b0.field_2) {
      operator_delete(local_16b0._M_dataplus._M_p,local_16b0.field_2._M_allocated_capacity + 1);
    }
    local_16d0._M_dataplus._M_p = (pointer)&local_16d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_16d0,"-28382","");
    BigNumber::BigNumber((BigNumber *)&local_1b10,&local_16d0);
    bVar6 = BigNumber::isNegative((BigNumber *)&local_1b10);
    if (!bVar6) {
      __assert_fail("BigNumber(\"-28382\").isNegative()",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x8c,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16d0._M_dataplus._M_p != &local_16d0.field_2) {
      operator_delete(local_16d0._M_dataplus._M_p,local_16d0.field_2._M_allocated_capacity + 1);
    }
    local_16f0._M_dataplus._M_p = (pointer)&local_16f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_16f0,"5","");
    BigNumber::BigNumber((BigNumber *)&local_1a90,&local_16f0);
    BigNumber::operator--((BigNumber *)&local_1ab0,(BigNumber *)&local_1a90,0);
    BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
    iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
    if (iVar7 != 0) {
      __assert_fail("BigNumber(\"5\")--.getString() == \"5\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x8f,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1ab0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a90._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16f0._M_dataplus._M_p != &local_16f0.field_2) {
      operator_delete(local_16f0._M_dataplus._M_p,local_16f0.field_2._M_allocated_capacity + 1);
    }
    local_1710._M_dataplus._M_p = (pointer)&local_1710.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1710,"5","");
    BigNumber::BigNumber((BigNumber *)&local_1ab0,&local_1710);
    pBVar9 = BigNumber::operator--((BigNumber *)&local_1ab0);
    BigNumber::getString_abi_cxx11_(&local_1b10,pBVar9);
    iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
    if (iVar7 != 0) {
      __assert_fail("(--BigNumber(\"5\")).getString() == \"4\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x90,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1ab0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1710._M_dataplus._M_p != &local_1710.field_2) {
      operator_delete(local_1710._M_dataplus._M_p,local_1710.field_2._M_allocated_capacity + 1);
    }
    local_1730._M_dataplus._M_p = (pointer)&local_1730.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1730,"10","");
    BigNumber::BigNumber((BigNumber *)&local_1a90,&local_1730);
    BigNumber::operator++((BigNumber *)&local_1ab0,(BigNumber *)&local_1a90,0);
    BigNumber::getString_abi_cxx11_(&local_1b10,(BigNumber *)&local_1ab0);
    iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
    if (iVar7 != 0) {
      __assert_fail("BigNumber(\"10\")++.getString() == \"10\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0x91,"int main()");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b10._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1ab0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a90._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1730._M_dataplus._M_p != &local_1730.field_2) {
      operator_delete(local_1730._M_dataplus._M_p,local_1730.field_2._M_allocated_capacity + 1);
    }
    local_1750._M_dataplus._M_p = (pointer)&local_1750.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1750,"10","");
    BigNumber::BigNumber((BigNumber *)&local_1ab0,&local_1750);
    pBVar9 = BigNumber::operator++((BigNumber *)&local_1ab0);
    BigNumber::getString_abi_cxx11_(&local_1b10,pBVar9);
    iVar7 = std::__cxx11::string::compare((char *)&local_1b10);
    if (iVar7 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b10._M_dataplus._M_p != paVar2) {
        operator_delete(local_1b10._M_dataplus._M_p,local_1b10.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1750._M_dataplus._M_p != &local_1750.field_2) {
        operator_delete(local_1750._M_dataplus._M_p,local_1750.field_2._M_allocated_capacity + 1);
      }
      local_1770._M_dataplus._M_p = (pointer)&local_1770.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1770,"10","");
      BigNumber::BigNumber((BigNumber *)&local_1b10,&local_1770);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1770._M_dataplus._M_p != &local_1770.field_2) {
        operator_delete(local_1770._M_dataplus._M_p,local_1770.field_2._M_allocated_capacity + 1);
      }
      BigNumber::operator++(&local_50,(BigNumber *)&local_1b10,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._numberString._M_dataplus._M_p != &local_50._numberString.field_2) {
        operator_delete(local_50._numberString._M_dataplus._M_p,
                        local_50._numberString.field_2._M_allocated_capacity + 1);
      }
      BigNumber::getString_abi_cxx11_(&local_1ab0,(BigNumber *)&local_1b10);
      iVar7 = std::__cxx11::string::compare((char *)&local_1ab0);
      if (iVar7 != 0) {
        __assert_fail("a.getString() == \"11\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0x96,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      BigNumber::operator++((BigNumber *)&local_1b10);
      BigNumber::getString_abi_cxx11_(&local_1ab0,(BigNumber *)&local_1b10);
      iVar7 = std::__cxx11::string::compare((char *)&local_1ab0);
      if (iVar7 != 0) {
        __assert_fail("a.getString() == \"12\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0x98,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      BigNumber::operator--(&local_70,(BigNumber *)&local_1b10,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._numberString._M_dataplus._M_p != &local_70._numberString.field_2) {
        operator_delete(local_70._numberString._M_dataplus._M_p,
                        local_70._numberString.field_2._M_allocated_capacity + 1);
      }
      BigNumber::getString_abi_cxx11_(&local_1ab0,(BigNumber *)&local_1b10);
      iVar7 = std::__cxx11::string::compare((char *)&local_1ab0);
      if (iVar7 != 0) {
        __assert_fail("a.getString() == \"11\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0x9a,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      BigNumber::operator--((BigNumber *)&local_1b10);
      BigNumber::getString_abi_cxx11_(&local_1ab0,(BigNumber *)&local_1b10);
      iVar7 = std::__cxx11::string::compare((char *)&local_1ab0);
      if (iVar7 != 0) {
        __assert_fail("a.getString() == \"10\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0x9c,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      local_1790._M_dataplus._M_p = (pointer)&local_1790.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1790,"45","");
      BigNumber::BigNumber((BigNumber *)&local_1a50,&local_1790);
      BigNumber::abs((BigNumber *)&local_1a90,(int)&local_1a50);
      BigNumber::getString_abi_cxx11_(&local_1ab0,(BigNumber *)&local_1a90);
      iVar7 = std::__cxx11::string::compare((char *)&local_1ab0);
      if (iVar7 != 0) {
        __assert_fail("BigNumber(\"45\").abs().getString() == \"45\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0x9f,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      paVar4 = &local_1a50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a50._M_dataplus._M_p != paVar4) {
        operator_delete(local_1a50._M_dataplus._M_p,local_1a50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1790._M_dataplus._M_p != &local_1790.field_2) {
        operator_delete(local_1790._M_dataplus._M_p,local_1790.field_2._M_allocated_capacity + 1);
      }
      local_17b0._M_dataplus._M_p = (pointer)&local_17b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_17b0,"-325","");
      BigNumber::BigNumber((BigNumber *)&local_1a50,&local_17b0);
      BigNumber::abs((BigNumber *)&local_1a90,(int)&local_1a50);
      BigNumber::getString_abi_cxx11_(&local_1ab0,(BigNumber *)&local_1a90);
      iVar7 = std::__cxx11::string::compare((char *)&local_1ab0);
      if (iVar7 != 0) {
        __assert_fail("BigNumber(\"-325\").abs().getString() == \"325\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xa0,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a50._M_dataplus._M_p != paVar4) {
        operator_delete(local_1a50._M_dataplus._M_p,local_1a50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_17b0._M_dataplus._M_p != &local_17b0.field_2) {
        operator_delete(local_17b0._M_dataplus._M_p,local_17b0.field_2._M_allocated_capacity + 1);
      }
      local_17d0._M_dataplus._M_p = (pointer)&local_17d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_17d0,"28374765","");
      BigNumber::BigNumber((BigNumber *)&local_1ab0,&local_17d0);
      uVar8 = BigNumber::digits((BigNumber *)&local_1ab0);
      if (uVar8 != 8) {
        __assert_fail("BigNumber(\"28374765\").digits() == 8",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xa3,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_17d0._M_dataplus._M_p != &local_17d0.field_2) {
        operator_delete(local_17d0._M_dataplus._M_p,local_17d0.field_2._M_allocated_capacity + 1);
      }
      local_17f0._M_dataplus._M_p = (pointer)&local_17f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_17f0,"-3092","");
      BigNumber::BigNumber((BigNumber *)&local_1ab0,&local_17f0);
      uVar8 = BigNumber::digits((BigNumber *)&local_1ab0);
      if (uVar8 != 4) {
        __assert_fail("BigNumber(\"-3092\").digits() == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xa4,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_17f0._M_dataplus._M_p != &local_17f0.field_2) {
        operator_delete(local_17f0._M_dataplus._M_p,local_17f0.field_2._M_allocated_capacity + 1);
      }
      local_1810._M_dataplus._M_p = (pointer)&local_1810.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1810,"234","");
      BigNumber::BigNumber((BigNumber *)&local_1a50,&local_1810);
      local_1830._M_dataplus._M_p = (pointer)&local_1830.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1830,"-45","");
      BigNumber::setString((BigNumber *)&local_1a90,(BigNumber *)&local_1a50,&local_1830);
      BigNumber::getString_abi_cxx11_(&local_1ab0,(BigNumber *)&local_1a90);
      iVar7 = std::__cxx11::string::compare((char *)&local_1ab0);
      if (iVar7 != 0) {
        __assert_fail("BigNumber(\"234\").setString(\"-45\").getString() == \"-45\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xa7,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1ab0._M_dataplus._M_p != paVar3) {
        operator_delete(local_1ab0._M_dataplus._M_p,local_1ab0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1830._M_dataplus._M_p != &local_1830.field_2) {
        operator_delete(local_1830._M_dataplus._M_p,local_1830.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a50._M_dataplus._M_p != paVar4) {
        operator_delete(local_1a50._M_dataplus._M_p,local_1a50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1810._M_dataplus._M_p != &local_1810.field_2) {
        operator_delete(local_1810._M_dataplus._M_p,local_1810.field_2._M_allocated_capacity + 1);
      }
      BigNumber::BigNumber((BigNumber *)&local_1ab0,10);
      local_1a90._M_dataplus._M_p = (pointer)0x5;
      BigNumber::operator=((BigNumber *)&local_1ab0,(longlong *)&local_1a90);
      paVar5 = &local_1850._numberString.field_2;
      local_1850._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1850,local_1ab0._M_dataplus._M_p,
                 local_1ab0._M_dataplus._M_p + local_1ab0._M_string_length);
      local_1a90._M_dataplus._M_p = (pointer)0x5;
      bVar6 = operator==(&local_1850,(longlong *)&local_1a90);
      if (!bVar6) {
        __assert_fail("c == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xac,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1850._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_1850._numberString._M_dataplus._M_p,
                        local_1850._numberString.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_1870._numberString.field_2;
      local_1870._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1870,local_1ab0._M_dataplus._M_p,
                 local_1ab0._M_dataplus._M_p + local_1ab0._M_string_length);
      BigNumber::BigNumber((BigNumber *)&local_1a90,5);
      bVar6 = operator==(&local_1870,(BigNumber *)&local_1a90);
      if (!bVar6) {
        __assert_fail("c == BigNumber(5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xad,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1870._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_1870._numberString._M_dataplus._M_p,
                        local_1870._numberString.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_1890._numberString.field_2;
      local_1890._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1890,local_1ab0._M_dataplus._M_p,
                 local_1ab0._M_dataplus._M_p + local_1ab0._M_string_length);
      local_18b0._M_dataplus._M_p = (pointer)&local_18b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_18b0,"5","");
      BigNumber::BigNumber((BigNumber *)&local_1a90,&local_18b0);
      bVar6 = operator==(&local_1890,(BigNumber *)&local_1a90);
      if (!bVar6) {
        __assert_fail("c == BigNumber(\"5\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xae,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_18b0._M_dataplus._M_p != &local_18b0.field_2) {
        operator_delete(local_18b0._M_dataplus._M_p,local_18b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1890._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_1890._numberString._M_dataplus._M_p,
                        local_1890._numberString.field_2._M_allocated_capacity + 1);
      }
      local_1a90._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a90,"83833","");
      BigNumber::operator=((BigNumber *)&local_1ab0,&local_1a90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_18d0._numberString.field_2;
      local_18d0._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_18d0,local_1ab0._M_dataplus._M_p,
                 local_1ab0._M_dataplus._M_p + local_1ab0._M_string_length);
      local_1a90._M_dataplus._M_p = (pointer)0x14779;
      bVar6 = operator==(&local_18d0,(longlong *)&local_1a90);
      if (!bVar6) {
        __assert_fail("c == 83833",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xb0,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_18d0._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_18d0._numberString._M_dataplus._M_p,
                        local_18d0._numberString.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_18f0._numberString.field_2;
      local_18f0._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_18f0,local_1ab0._M_dataplus._M_p,
                 local_1ab0._M_dataplus._M_p + local_1ab0._M_string_length);
      BigNumber::BigNumber((BigNumber *)&local_1a90,0x14779);
      bVar6 = operator==(&local_18f0,(BigNumber *)&local_1a90);
      if (!bVar6) {
        __assert_fail("c == BigNumber(83833)",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xb1,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_18f0._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_18f0._numberString._M_dataplus._M_p,
                        local_18f0._numberString.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_1910._numberString.field_2;
      local_1910._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1910,local_1ab0._M_dataplus._M_p,
                 local_1ab0._M_dataplus._M_p + local_1ab0._M_string_length);
      local_1930._M_dataplus._M_p = (pointer)&local_1930.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1930,"83833","");
      BigNumber::BigNumber((BigNumber *)&local_1a90,&local_1930);
      bVar6 = operator==(&local_1910,(BigNumber *)&local_1a90);
      if (!bVar6) {
        __assert_fail("c == BigNumber(\"83833\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xb2,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a90._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a90._M_dataplus._M_p,local_1a90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1930._M_dataplus._M_p != &local_1930.field_2) {
        operator_delete(local_1930._M_dataplus._M_p,local_1930.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1910._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_1910._numberString._M_dataplus._M_p,
                        local_1910._numberString.field_2._M_allocated_capacity + 1);
      }
      BigNumber::BigNumber((BigNumber *)&local_1a90,0x28);
      paVar5 = &local_1950._numberString.field_2;
      local_1950._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1950,local_1a90._M_dataplus._M_p,
                 local_1a90._M_dataplus._M_p + local_1a90._M_string_length);
      local_1a50._M_dataplus._M_p = (pointer)0x28;
      bVar6 = operator==(&local_1950,(longlong *)&local_1a50);
      if (!bVar6) {
        __assert_fail("d == 40",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xb6,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1950._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_1950._numberString._M_dataplus._M_p,
                        local_1950._numberString.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_1970._numberString.field_2;
      local_1970._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1970,local_1a90._M_dataplus._M_p,
                 local_1a90._M_dataplus._M_p + local_1a90._M_string_length);
      local_1a50._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a50,"40","");
      bVar6 = operator==(&local_1970,&local_1a50);
      if (!bVar6) {
        __assert_fail("d == \"40\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xb7,"int main()");
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a50._M_dataplus._M_p != paVar4) {
        operator_delete(local_1a50._M_dataplus._M_p,local_1a50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1970._numberString._M_dataplus._M_p != paVar5) {
        operator_delete(local_1970._numberString._M_dataplus._M_p,
                        local_1970._numberString.field_2._M_allocated_capacity + 1);
      }
      paVar5 = &local_1990._numberString.field_2;
      local_1990._numberString._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1990,local_1a90._M_dataplus._M_p,
                 local_1a90._M_dataplus._M_p + local_1a90._M_string_length);
      local_19b0._M_dataplus._M_p = (pointer)&local_19b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_19b0,"40","");
      BigNumber::BigNumber((BigNumber *)&local_1a50,&local_19b0);
      bVar6 = operator==(&local_1990,(BigNumber *)&local_1a50);
      if (bVar6) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a50._M_dataplus._M_p != paVar4) {
          operator_delete(local_1a50._M_dataplus._M_p,local_1a50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_19b0._M_dataplus._M_p != &local_19b0.field_2) {
          operator_delete(local_19b0._M_dataplus._M_p,local_19b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1990._numberString._M_dataplus._M_p != paVar5) {
          operator_delete(local_1990._numberString._M_dataplus._M_p,
                          local_1990._numberString.field_2._M_allocated_capacity + 1);
        }
        paVar5 = &local_19d0._numberString.field_2;
        local_19d0._numberString._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_19d0,local_1a90._M_dataplus._M_p,
                   local_1a90._M_dataplus._M_p + local_1a90._M_string_length);
        BigNumber::BigNumber((BigNumber *)&local_1a50,0x28);
        bVar6 = operator==(&local_19d0,(BigNumber *)&local_1a50);
        if (!bVar6) {
          __assert_fail("d == BigNumber(40)",
                        "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                        ,0xb9,"int main()");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a50._M_dataplus._M_p != paVar4) {
          operator_delete(local_1a50._M_dataplus._M_p,local_1a50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_19d0._numberString._M_dataplus._M_p != paVar5) {
          operator_delete(local_19d0._numberString._M_dataplus._M_p,
                          local_19d0._numberString.field_2._M_allocated_capacity + 1);
        }
        local_1a50._M_dataplus._M_p = (pointer)0x28;
        BigNumber::operator=((BigNumber *)&local_1a90,(longlong *)&local_1a50);
        paVar5 = &local_19f0._numberString.field_2;
        local_19f0._numberString._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_19f0,local_1a90._M_dataplus._M_p,
                   local_1a90._M_dataplus._M_p + local_1a90._M_string_length);
        local_1a50._M_dataplus._M_p = (pointer)0x28;
        bVar6 = operator==(&local_19f0,(longlong *)&local_1a50);
        if (bVar6) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_19f0._numberString._M_dataplus._M_p != paVar5) {
            operator_delete(local_19f0._numberString._M_dataplus._M_p,
                            local_19f0._numberString.field_2._M_allocated_capacity + 1);
          }
          local_1a50._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a50,"40","");
          BigNumber::operator=((BigNumber *)&local_1a90,&local_1a50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a50._M_dataplus._M_p != paVar4) {
            operator_delete(local_1a50._M_dataplus._M_p,local_1a50.field_2._M_allocated_capacity + 1
                           );
          }
          paVar4 = &local_1a10._numberString.field_2;
          local_1a10._numberString._M_dataplus._M_p = (pointer)paVar4;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a10,local_1a90._M_dataplus._M_p,
                     local_1a90._M_dataplus._M_p + local_1a90._M_string_length);
          local_1a50._M_dataplus._M_p = (pointer)0x28;
          bVar6 = operator==(&local_1a10,(longlong *)&local_1a50);
          if (bVar6) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a10._numberString._M_dataplus._M_p != paVar4) {
              operator_delete(local_1a10._numberString._M_dataplus._M_p,
                              local_1a10._numberString.field_2._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"BigNumber ran successfully.",0x1b);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
            std::ostream::put(-0x48);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a90._M_dataplus._M_p != paVar1) {
              operator_delete(local_1a90._M_dataplus._M_p,
                              local_1a90.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1ab0._M_dataplus._M_p != paVar3) {
              operator_delete(local_1ab0._M_dataplus._M_p,
                              local_1ab0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b10._M_dataplus._M_p != paVar2) {
              operator_delete(local_1b10._M_dataplus._M_p,
                              local_1b10.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
              operator_delete(local_1af0._M_dataplus._M_p,
                              local_1af0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1ad0._M_dataplus._M_p != &local_1ad0.field_2) {
              operator_delete(local_1ad0._M_dataplus._M_p,
                              local_1ad0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a70._M_dataplus._M_p != &local_1a70.field_2) {
              operator_delete(local_1a70._M_dataplus._M_p,
                              local_1a70.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a30._M_dataplus._M_p != &local_1a30.field_2) {
              operator_delete(local_1a30._M_dataplus._M_p,
                              local_1a30.field_2._M_allocated_capacity + 1);
            }
            return 0;
          }
          __assert_fail("d == 40",
                        "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                        ,0xbd,"int main()");
        }
        __assert_fail("d == 40",
                      "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                      ,0xbb,"int main()");
      }
      __assert_fail("d == BigNumber(\"40\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp"
                    ,0xb8,"int main()");
    }
    __assert_fail("(++BigNumber(\"10\")).getString() == \"11\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                  0x92,"int main()");
  }
  __assert_fail("BigNumber(\"10\") < BigNumber(\"20\")",
                "/workspace/llm4binary/github/license_c_cmakelists/Limeoats[P]BigNumber/main.cpp",
                0x68,"int main()");
}

Assistant:

int main() {
    //Addition
    assert((BigNumber(50) + BigNumber(32)).getString() == "82");
    assert((BigNumber(5) + BigNumber(622)).getString() == "627");
    assert((BigNumber("-33") + BigNumber("8")).getString() == "-25");
    assert((BigNumber("15535") + BigNumber("0")).getString() == "15535");
    assert((BigNumber("126") + BigNumber("39285")).getString() == "39411");
    assert((BigNumber("0") + BigNumber("0")).getString() == "0");
    assert(BigNumber(5) + 10 == 15);
    assert(BigNumber("-41") + 40 == -1);
    BigNumber ad1(600);
    ad1 += 50;
    ad1 += "50";
    assert(ad1.getString() == "700");
    assert(ad1 == 700);

    //Subtraction
    assert((BigNumber("50") - BigNumber("32")).getString() == "18");
    assert((BigNumber("50") - BigNumber("60")).getString() == "-10");
    assert((BigNumber("0") - BigNumber("46")).getString() == "-46");
    assert((BigNumber("50") - BigNumber("50")).getString() == "0");
    assert((BigNumber("482847") - BigNumber("89787941")).getString() == "-89305094");
    assert((BigNumber("6828") - BigNumber("1")).getString() == "6827");
    assert((BigNumber("100") - BigNumber("50")).getString() == "50");
    assert((BigNumber("42") - BigNumber("49")).getString() == "-7");
    assert((BigNumber("100") - BigNumber("5")) == 95);
    assert((BigNumber("-100") - BigNumber("-5")) == -95);
    BigNumber sb1 = 200;
    sb1 -= 40;
    assert(sb1 == 160);
    sb1 = sb1 - 180;
    assert(sb1 == "-20");
    sb1 -= "20";
    assert(sb1 == BigNumber(-40));

    //Multiplication
    assert((BigNumber("4") * BigNumber("12")).getString() == "48");
    assert((BigNumber("3002") * BigNumber("1")).getString() == "3002");
    assert((BigNumber("99") * BigNumber("0")).getString() == "0");
    assert((BigNumber("-5") * BigNumber("5")).getString() == "-25");
    assert((BigNumber("-33") * BigNumber("-2")).getString() == "66");
    assert((BigNumber("283") * BigNumber("382871")).getString() == "108352493");
    BigNumber ml1 = 4;
    ml1 *= 6;
    assert(ml1 == "24");
    ml1 = BigNumber(5) * 6;
    assert(ml1 == 30);
    ml1 *= "5000";
    assert(ml1 == 150000);

    //Division
    assert(BigNumber("25").divide(BigNumber("5")) == 5);
    assert(BigNumber("48").divide(BigNumber("6")) == 8);
    assert(BigNumber("100").divide(BigNumber("5")) == 20);
    BigNumber dv1 = 100;
    dv1 /= 25;
    assert(dv1 == 4);
    dv1 = dv1 / dv1;
    assert(dv1 == 1);
    dv1 /= 1;
    assert(dv1 == 1);
    dv1 = -5;
    dv1 /= 5;
    assert(dv1 == -1);
    dv1 = 3000;
    dv1 /= 300;
    assert(dv1 == 10);
    dv1 = 25485;
    dv1 /= 5;
    assert(dv1 == "5097");

    //Exponentiation
    assert((BigNumber("2").pow(3)).getString() == "8");
    assert((BigNumber("1").pow(38)).getString() == "1");
    assert((BigNumber("5").pow(2)).getString() == "25");
    assert((BigNumber("10").pow(10)).getString() == "10000000000");
    assert((BigNumber("5").pow(1)).getString() == "5");
    assert((BigNumber("5").pow(0)).getString() == "1");
    assert((BigNumber("-5").pow(2)).getString() == "25");

    //Equals
    assert(BigNumber("4") == BigNumber("4"));
    assert(BigNumber("-3") == BigNumber("-3"));
    assert(BigNumber("0") == BigNumber("0"));
    assert(BigNumber("938283828178273") == BigNumber("938283828178273"));

    //Greater than
    assert(BigNumber("5") > BigNumber("2"));
    assert(BigNumber("30") > BigNumber("-40"));
    assert(BigNumber("-5") > BigNumber("-10"));
    assert(BigNumber("0") > BigNumber("-1"));

    //Less than
    assert(BigNumber("10") < BigNumber("20"));
    assert(BigNumber("-5") < BigNumber("0"));
    assert(BigNumber("30") < BigNumber("30000"));

    //Greater than or equal to
    assert(BigNumber("5") >= BigNumber("0"));
    assert(BigNumber("-5") >= BigNumber("-5"));
    assert(BigNumber("-5") >= BigNumber("-10"));
    assert(BigNumber("0") >= BigNumber("0"));
    assert(BigNumber("32") >= BigNumber("-32"));
    assert(BigNumber("2") >= BigNumber("0001"));

    //Less than or equal to
    assert(BigNumber("5") <= BigNumber("10"));
    assert(BigNumber("0") <= BigNumber("0"));
    assert(BigNumber("-5") <= BigNumber("0"));
    assert(BigNumber("30") <= BigNumber("30"));
    assert(BigNumber("400") <= BigNumber("392342"));

    //Index
    assert(BigNumber("423")[1] == 2);
    assert(BigNumber("0")[0] == 0);
    assert(BigNumber("-5")[1] == 5);

    //Even
    assert(BigNumber("426").isEven());
    assert(BigNumber("-20").isEven());

    //Odd
    assert(BigNumber("83").isOdd());
    assert(BigNumber("-27").isOdd());

    //Positive
    assert(BigNumber("38").isPositive());

    //Negative
    assert(BigNumber("-28382").isNegative());

    //Increment/Decrement operators
    assert(BigNumber("5")--.getString() == "5");
    assert((--BigNumber("5")).getString() == "4");
    assert(BigNumber("10")++.getString() == "10");
    assert((++BigNumber("10")).getString() == "11");

    BigNumber a("10");
    a++;
    assert(a.getString() == "11");
    ++a;
    assert(a.getString() == "12");
    a--;
    assert(a.getString() == "11");
    --a;
    assert(a.getString() == "10");

    //Absolute value
    assert(BigNumber("45").abs().getString() == "45");
    assert(BigNumber("-325").abs().getString() == "325");

    //Digits
    assert(BigNumber("28374765").digits() == 8);
    assert(BigNumber("-3092").digits() == 4);

    //Set string
    assert(BigNumber("234").setString("-45").getString() == "-45");

    //Assignment operator
    BigNumber c(10);
    c = 5;
    assert(c == 5);
    assert(c == BigNumber(5));
    assert(c == BigNumber("5"));
    c = "83833";
    assert(c == 83833);
    assert(c == BigNumber(83833));
    assert(c == BigNumber("83833"));

    //Equals testing
    BigNumber d(40);
    assert(d == 40);
    assert(d == "40");
    assert(d == BigNumber("40"));
    assert(d == BigNumber(40));
    d = 40;
    assert(d == 40);
    d = "40";
    assert(d == 40);


    std::cout << "BigNumber ran successfully." << std::endl;
}